

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleWidget::focusChild(QAccessibleWidget *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QObject *pQVar3;
  QAccessibleInterface *pQVar4;
  QWidget *pQVar5;
  QAccessibleWidget *pQVar6;
  long lVar7;
  QWidget *pQVar8;
  
  pQVar2 = widget(this);
  bVar1 = QWidget::hasFocus(pQVar2);
  if (bVar1) {
    pQVar3 = (QObject *)(**(code **)(*(long *)this + 0x18))(this);
    pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar3);
    return pQVar4;
  }
  pQVar2 = widget(this);
  pQVar2 = QWidget::focusWidget(pQVar2);
  if (pQVar2 != (QWidget *)0x0) {
    pQVar5 = widget(this);
    for (pQVar8 = pQVar2; (pQVar8 != pQVar5 && (pQVar8 != (QWidget *)0x0));
        pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10)) {
    }
    if (pQVar8 != (QWidget *)0x0) {
      pQVar6 = (QAccessibleWidget *)QAccessible::queryAccessibleInterface(&pQVar2->super_QObject);
      if (pQVar6 == this || pQVar6 == (QAccessibleWidget *)0x0) {
        return (QAccessibleInterface *)pQVar6;
      }
      lVar7 = (**(code **)(*(long *)pQVar6 + 0x30))(pQVar6);
      if (lVar7 == 0) {
        return (QAccessibleInterface *)pQVar6;
      }
      pQVar4 = (QAccessibleInterface *)(**(code **)(*(long *)pQVar6 + 0x30))(pQVar6);
      return pQVar4;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleWidget::focusChild() const
{
    if (widget()->hasFocus())
        return QAccessible::queryAccessibleInterface(object());

    QWidget *fw = widget()->focusWidget();
    if (!fw)
        return nullptr;

    if (isAncestor(widget(), fw)) {
        QAccessibleInterface *iface = QAccessible::queryAccessibleInterface(fw);
        if (!iface || iface == this || !iface->focusChild())
            return iface;
        return iface->focusChild();
    }
    return nullptr;
}